

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O3

h__Writer * __thiscall
ASDCP::ATMOS::MXFWriter::h__Writer::SetSourceStream
          (h__Writer *this,DCDataDescriptor *DDesc,byte_t *essenceCoding,string *packageLabel,
          string *defLabel)

{
  int iVar1;
  int iVar2;
  ui32_t BytesPerEditUnit;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  MDDEntry *pMVar14;
  ILogSink *this_00;
  undefined1 *puVar15;
  UL *in_R9;
  UL local_108;
  string local_e8;
  undefined1 local_c8 [128];
  bool local_48;
  byte_t local_47 [8];
  byte_t abStack_3f [15];
  
  if (DDesc[0x14].EditRate.Numerator == 1) {
    iVar1 = *(int *)essenceCoding;
    iVar2 = *(int *)(essenceCoding + 4);
    if ((((((ASDCP::EditRate_24 == iVar1) && (DAT_002550d4 == iVar2)) ||
          ((ASDCP::EditRate_25 == iVar1 && (DAT_002550fc == iVar2)))) ||
         ((ASDCP::EditRate_30 == iVar1 && (DAT_00255104 == iVar2)))) ||
        ((((ASDCP::EditRate_48 == iVar1 && (DAT_002550e4 == iVar2)) ||
          (((ASDCP::EditRate_50 == iVar1 && (DAT_0025510c == iVar2)) ||
           ((ASDCP::EditRate_60 == iVar1 && (DAT_00255114 == iVar2)))))) ||
         (((ASDCP::EditRate_96 == iVar1 && (DAT_0025511c == iVar2)) ||
          ((ASDCP::EditRate_100 == iVar1 && (DAT_00255124 == iVar2)))))))) ||
       ((((ASDCP::EditRate_120 == iVar1 && (DAT_0025512c == iVar2)) ||
         ((ASDCP::EditRate_192 == iVar1 && (DAT_00255134 == iVar2)))) ||
        (((ASDCP::EditRate_200 == iVar1 && (DAT_0025513c == iVar2)) ||
         ((ASDCP::EditRate_240 == iVar1 && (DAT_00255144 == iVar2)))))))) {
      lVar3._0_4_ = DDesc->ContainerDuration;
      lVar3._4_1_ = DDesc->AssetID[0];
      lVar3._5_1_ = DDesc->AssetID[1];
      lVar3._6_1_ = DDesc->AssetID[2];
      lVar3._7_1_ = DDesc->AssetID[3];
      if (lVar3 == 0) {
        __assert_fail("m_Dict",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_ATMOS.cpp"
                      ,0x20a,
                      "ASDCP::Result_t ASDCP::ATMOS::MXFWriter::h__Writer::SetSourceStream(const ASDCP::DCData::DCDataDescriptor &, const byte_t *, const std::string &, const std::string &)"
                     );
      }
      uVar4 = *(undefined8 *)essenceCoding;
      uVar5 = *(undefined8 *)(essenceCoding + 8);
      uVar6 = *(undefined8 *)(essenceCoding + 0x10);
      uVar7 = *(undefined8 *)(essenceCoding + 0x18);
      uVar8 = *(undefined8 *)(essenceCoding + 0x24);
      DDesc[0x29].EditRate = *(Rational *)(essenceCoding + 0x1c);
      DDesc[0x29].ContainerDuration = (int)uVar8;
      DDesc[0x29].AssetID[0] = (char)((ulong)uVar8 >> 0x20);
      DDesc[0x29].AssetID[1] = (char)((ulong)uVar8 >> 0x28);
      DDesc[0x29].AssetID[2] = (char)((ulong)uVar8 >> 0x30);
      DDesc[0x29].AssetID[3] = (char)((ulong)uVar8 >> 0x38);
      *(undefined8 *)(DDesc[0x28].DataEssenceCoding + 4) = uVar6;
      *(undefined8 *)(DDesc[0x28].DataEssenceCoding + 0xc) = uVar7;
      *(undefined8 *)(DDesc[0x28].AssetID + 4) = uVar4;
      *(undefined8 *)(DDesc[0x28].AssetID + 0xc) = uVar5;
      if (packageLabel != (string *)0x0) {
        uVar9 = *(undefined4 *)&packageLabel->_M_string_length;
        uVar10 = *(undefined1 *)((long)&packageLabel->_M_string_length + 4);
        uVar11 = *(undefined1 *)((long)&packageLabel->_M_string_length + 5);
        uVar12 = *(undefined1 *)((long)&packageLabel->_M_string_length + 6);
        uVar13 = *(undefined1 *)((long)&packageLabel->_M_string_length + 7);
        DDesc[0x29].EditRate = (Rational)(packageLabel->_M_dataplus)._M_p;
        DDesc[0x29].ContainerDuration = uVar9;
        DDesc[0x29].AssetID[0] = uVar10;
        DDesc[0x29].AssetID[1] = uVar11;
        DDesc[0x29].AssetID[2] = uVar12;
        DDesc[0x29].AssetID[3] = uVar13;
      }
      DCData_DDesc_to_MD(this,DDesc);
      if (*(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                   _vptr_TrackFileWriter < 0) {
        return this;
      }
      pMVar14 = Dictionary::Type(*(Dictionary **)&DDesc->ContainerDuration,MDD_PrivateDCDataEssence)
      ;
      uVar4 = *(undefined8 *)(pMVar14->ul + 8);
      *(undefined8 *)(DDesc[0x29].AssetID + 4) = *(undefined8 *)pMVar14->ul;
      *(undefined8 *)(DDesc[0x29].AssetID + 0xc) = uVar4;
      DDesc[0x29].DataEssenceCoding[3] = '\x01';
      if (DDesc[0x14].EditRate.Numerator == 1) {
        DDesc[0x14].EditRate.Numerator = 2;
        puVar15 = Kumu::RESULT_OK;
      }
      else {
        puVar15 = Kumu::RESULT_STATE;
      }
      Kumu::Result_t::Result_t((Result_t *)local_c8,(Result_t *)puVar15);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_c8);
      Kumu::Result_t::~Result_t((Result_t *)local_c8);
      if (*(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                   _vptr_TrackFileWriter < 0) {
        return this;
      }
      BytesPerEditUnit = *(ui32_t *)(DDesc[0x28].AssetID + 4);
      pMVar14 = Dictionary::Type(*(Dictionary **)&DDesc->ContainerDuration,
                                 MDD_PrivateDCDataWrappingFrame);
      local_e8._M_string_length._0_1_ = 1;
      local_e8._9_8_ = *(undefined8 *)pMVar14->ul;
      local_e8.field_2._1_8_ = *(undefined8 *)(pMVar14->ul + 8);
      local_e8._M_dataplus._M_p = (pointer)&PTR__IArchive_0021d318;
      local_108.super_Identifier<16U>.m_HasValue = true;
      local_108.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)(DDesc[0x29].AssetID + 4);
      local_108.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(DDesc[0x29].AssetID + 0xc);
      local_108.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_0021d318;
      pMVar14 = Dictionary::Type(*(Dictionary **)&DDesc->ContainerDuration,MDD_DataDataDef);
      local_48 = true;
      local_47 = *(byte_t (*) [8])pMVar14->ul;
      abStack_3f._0_8_ = *(undefined8 *)(pMVar14->ul + 8);
      local_c8._120_8_ = &PTR__IArchive_0021d318;
      local_c8._104_8_ = &PTR__IArchive_00222760;
      local_c8._112_8_ = *(undefined8 *)(DDesc[0x28].AssetID + 4);
      h__ASDCPWriter::WriteASDCPHeader
                ((h__ASDCPWriter *)local_c8,(string *)DDesc,(UL *)defLabel,&local_e8,in_R9,
                 &local_108,(Rational *)(local_c8 + 0x78),(int)local_c8 + 0x68,BytesPerEditUnit);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_c8);
      Kumu::Result_t::~Result_t((Result_t *)local_c8);
      return this;
    }
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"DCDataDescriptor.EditRate is not a supported value: %d/%d\n",
               (ulong)*(uint *)essenceCoding,(ulong)*(uint *)(essenceCoding + 4));
    puVar15 = ASDCP::RESULT_RAW_FORMAT;
  }
  else {
    puVar15 = Kumu::RESULT_STATE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar15);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::ATMOS::MXFWriter::h__Writer::SetSourceStream(ASDCP::DCData::DCDataDescriptor const& DDesc,
						    const byte_t * essenceCoding,
						    const std::string& packageLabel,
						    const std::string& defLabel)
{
  if ( ! m_State.Test_INIT() )
    return RESULT_STATE;

  if ( DDesc.EditRate != EditRate_24
       && DDesc.EditRate != EditRate_25
       && DDesc.EditRate != EditRate_30
       && DDesc.EditRate != EditRate_48
       && DDesc.EditRate != EditRate_50
       && DDesc.EditRate != EditRate_60
       && DDesc.EditRate != EditRate_96
       && DDesc.EditRate != EditRate_100
       && DDesc.EditRate != EditRate_120
       && DDesc.EditRate != EditRate_192
       && DDesc.EditRate != EditRate_200
       && DDesc.EditRate != EditRate_240 )
  {
    DefaultLogSink().Error("DCDataDescriptor.EditRate is not a supported value: %d/%d\n",
                           DDesc.EditRate.Numerator, DDesc.EditRate.Denominator);
    return RESULT_RAW_FORMAT;
  }

  assert(m_Dict);
  m_DDesc = DDesc;
  if (NULL != essenceCoding)
      memcpy(m_DDesc.DataEssenceCoding, essenceCoding, SMPTE_UL_LENGTH);
  Result_t result = DCData_DDesc_to_MD(m_DDesc);

  if ( ASDCP_SUCCESS(result) )
  {
    memcpy(m_EssenceUL, m_Dict->ul(MDD_PrivateDCDataEssence), SMPTE_UL_LENGTH);
    m_EssenceUL[SMPTE_UL_LENGTH-1] = 1; // first (and only) essence container
    result = m_State.Goto_READY();
  }

  if ( ASDCP_SUCCESS(result) )
  {
    ui32_t TCFrameRate = m_DDesc.EditRate.Numerator;

    result = WriteASDCPHeader(packageLabel, UL(m_Dict->ul(MDD_PrivateDCDataWrappingFrame)),
			      defLabel, UL(m_EssenceUL), UL(m_Dict->ul(MDD_DataDataDef)),
			      m_DDesc.EditRate, TCFrameRate);
  }

  return result;
}